

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBlock
          (AsciiParser *this,Specifier spec,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          bool in_variantStaement)

{
  map<_40cfd1d7_> *this_00;
  bool bVar1;
  ostream *poVar2;
  long primIdx_00;
  size_type sVar3;
  mapped_type *__x;
  error_type *peVar4;
  int64_t iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Specifier s;
  Specifier s_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_00;
  int iVar6;
  char *pcVar7;
  Path *this_01;
  Specifier spec_00;
  string variantName;
  char local_510;
  char c_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  Identifier def;
  string pTy;
  string prim_name;
  Identifier prim_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  vmap;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> propNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ostringstream ss_e;
  Identifier tok;
  VariantSetList variantSetList;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  props;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  in_metas;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = parentPrimIdx;
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  def.super_string._M_dataplus._M_p = (pointer)&def.super_string.field_2;
  def.super_string._M_string_length = 0;
  def.super_string.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadIdentifier(this,&def.super_string);
  if (bVar1) {
    bVar1 = ::std::operator==(&def.super_string,"def");
    if (((bVar1) || (bVar1 = ::std::operator==(&def.super_string,"over"), bVar1)) ||
       (bVar1 = ::std::operator==(&def.super_string,"class"), bVar1)) {
      bVar1 = ::std::operator==(&def.super_string,"def");
      if (bVar1) {
        if (spec != Def) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseBlock");
          poVar2 = ::std::operator<<(poVar2,"():");
          iVar6 = 0x12db;
          goto LAB_002e990e;
        }
      }
      else {
        bVar1 = ::std::operator==(&def.super_string,"over");
        if (bVar1) {
          if (spec != Over) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseBlock");
            poVar2 = ::std::operator<<(poVar2,"():");
            iVar6 = 0x12e1;
LAB_002e990e:
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar6);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)&ss_e,
                                       "Internal error. Invalid Specifier token combination. def = "
                                      );
            poVar2 = ::std::operator<<(poVar2,(string *)&def);
            poVar2 = ::std::operator<<(poVar2,", spec = ");
            tinyusdz::to_string_abi_cxx11_((string *)&vmap,(tinyusdz *)(ulong)spec,s);
            poVar2 = ::std::operator<<(poVar2,(string *)&vmap);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::_M_dispose();
            goto LAB_002e9c30;
          }
        }
        else {
          bVar1 = ::std::operator==(&def.super_string,"class");
          if ((spec != Class) && (bVar1)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseBlock");
            poVar2 = ::std::operator<<(poVar2,"():");
            iVar6 = 0x12e7;
            goto LAB_002e990e;
          }
        }
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (((bVar1) && (bVar1 = Char1(this,(char *)&ss_e), bVar1)) && (bVar1 = Rewind(this,1), bVar1)
         ) {
        prim_type.super_string._M_dataplus._M_p = (pointer)&prim_type.super_string.field_2;
        prim_type.super_string._M_string_length = 0;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)iVar5 >> 8),ss_e);
        prim_type.super_string.field_2._M_local_buf[0] = '\0';
        if (((ss_e == (ostringstream)0x22) ||
            (bVar1 = ReadIdentifier(this,&prim_type.super_string), bVar1)) &&
           (bVar1 = SkipWhitespaceAndNewline(this,true), bVar1)) {
          prim_name._M_dataplus._M_p = (pointer)&prim_name.field_2;
          prim_name._M_string_length = 0;
          prim_name.field_2._M_local_buf[0] = '\0';
          bVar1 = ReadBasicType(this,&prim_name);
          if (bVar1) {
            bVar1 = ValidatePrimElementName(&prim_name);
            if (!bVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,"[ASCII]");
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ParseBlock");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1318);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)&ss_e,"Prim name contains invalid chacracter.");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&vmap);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              goto LAB_002e9d61;
            }
            bVar1 = SkipWhitespaceAndNewline(this,true);
            if (!bVar1) goto LAB_002e9d61;
            in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &in_metas._M_t._M_impl.super__Rb_tree_header._M_header;
            in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            in_metas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            bVar1 = LookChar1(this,(char *)&ss_e);
            if (((bVar1) &&
                (((ss_e != (ostringstream)0x28 ||
                  ((bVar1 = ParsePrimMetas(this,&in_metas), bVar1 &&
                   (bVar1 = SkipWhitespaceAndNewline(this,true), bVar1)))) &&
                 (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)))) &&
               ((bVar1 = Expect(this,'{'), bVar1 &&
                (bVar1 = SkipWhitespaceAndNewline(this,true), bVar1)))) {
              props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &props._M_t._M_impl.super__Rb_tree_header._M_header;
              props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &variantSetList._M_t._M_impl.super__Rb_tree_header._M_header;
              variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
              ;
              variantSetList._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
              bVar1 = ::std::operator==((string *)&ss_e,"/");
              if (bVar1) {
                ::std::__cxx11::string::append((string *)&ss_e);
              }
              else {
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vmap,"/",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&prim_name);
                ::std::__cxx11::string::append((string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&(this->_path_stack).c,(value_type *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
LAB_002e9dfe:
              do {
                bVar1 = Eof(this);
                if (bVar1) {
LAB_002ea1e6:
                  ::std::__cxx11::string::string((string *)&pTy,(string *)&prim_type);
                  if (this->_primspec_mode == true) {
                    if ((this->_primspec_fun).super__Function_base._M_manager == (_Manager_type)0x0)
                    {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,"[ASCII]");
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13d1);
                      ::std::operator<<(poVar2," ");
                      poVar2 = ::std::operator<<((ostream *)&ss_e,
                                                 "[Internal Error] PrimSpec handler is not found.");
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&vmap);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    }
                    else {
                      GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                      ::std::__cxx11::string::string
                                ((string *)&tok.super_string,"",(allocator *)&variantName);
                      Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::string((string *)&ss_e,"",(allocator *)&variantName);
                      this_01 = (Path *)&tok;
                      Path::Path(this_01,&prim_name,(string *)&ss_e);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::function<$3792144$>::operator()
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&variantName,&this->_primspec_fun,(Path *)&vmap,spec,
                                 &prim_type.super_string,this_01,primIdx,parentPrimIdx,&props,
                                 &in_metas,&variantSetList);
                      if (local_510 != '\0') {
                        nonstd::expected_lite::
                        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&variantName);
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                        goto LAB_002ea8d7;
                      }
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13cd);
                      ::std::operator<<(poVar2," ");
                      ::std::__cxx11::string::string
                                ((string *)&local_368,
                                 "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
                                 (allocator *)&local_70);
                      peVar4 = nonstd::expected_lite::
                               expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&variantName);
                      fmt::
                      format<tinyusdz::ascii::Identifier,std::__cxx11::string,std::__cxx11::string>
                                ((string *)&c_2,(fmt *)&local_368,&prim_type.super_string,
                                 (Identifier *)&prim_name,peVar4,&this_01->_prim_part);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&c_2);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&c_2);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&variantName);
                      Path::~Path((Path *)&tok);
                      Path::~Path((Path *)&vmap);
                    }
LAB_002eaccd:
                    bVar1 = false;
                  }
                  else {
                    if (prim_type.super_string._M_string_length == 0) {
                      ::std::__cxx11::string::assign((char *)&pTy);
                    }
                    this_00 = &this->_prim_construct_fun_map;
                    sVar3 = ::std::map<$40cfd1d7$>::count(this_00,&pTy);
                    if ((sVar3 == 0) && ((this->_option).allow_unknown_prim == true)) {
                      ::std::__cxx11::string::assign((char *)&pTy);
                    }
                    sVar3 = ::std::map<$40cfd1d7$>::count(this_00,&pTy);
                    if (sVar3 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13f7);
                      ::std::operator<<(poVar2," ");
                      ::std::__cxx11::string::string
                                ((string *)&tok,
                                 "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing."
                                 ,(allocator *)&variantName);
                      fmt::format<std::__cxx11::string>
                                ((string *)&vmap,(fmt *)&tok,(string *)&pTy,args);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&vmap);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::stringbuf::str();
                      PushWarn(this,(string *)&vmap);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    }
                    else {
                      __x = ::std::map<$40cfd1d7$>::operator[](this_00,&pTy);
                      ::std::function<$3792144$>::function((function<_3792144_> *)&c_2,__x);
                      GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                      ::std::__cxx11::string::string
                                ((string *)&tok.super_string,"",(allocator *)&variantName);
                      Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::string((string *)&ss_e,"",(allocator *)&variantName);
                      Path::Path((Path *)&tok,&prim_name,(string *)&ss_e);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::function<$3792144$>::operator()
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&variantName,(function<_3792144_> *)&c_2,(Path *)&vmap,spec,
                                 &prim_type.super_string,(Path *)&tok,primIdx,parentPrimIdx,&props,
                                 &in_metas,&variantSetList);
                      if (local_510 == '\0') {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                        poVar2 = ::std::operator<<(poVar2,":");
                        poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                        poVar2 = ::std::operator<<(poVar2,"():");
                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13f1);
                        ::std::operator<<(poVar2," ");
                        ::std::operator+(&local_50,"Constructing Prim type `",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&pTy);
                        ::std::operator+(&local_70,&local_50,"` failed: ");
                        peVar4 = nonstd::expected_lite::
                                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&variantName);
                        ::std::operator+(&local_368,&local_70,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)peVar4);
                        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
                        ::std::operator<<(poVar2,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,(string *)&local_368);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        nonstd::expected_lite::
                        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&variantName);
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                        if ((_Manager_type)local_4f0._M_allocated_capacity != (_Manager_type)0x0) {
                          (*(code *)local_4f0._M_allocated_capacity)(&c_2,&c_2,3);
                        }
                        goto LAB_002eaccd;
                      }
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&variantName);
                      Path::~Path((Path *)&tok);
                      Path::~Path((Path *)&vmap);
                      if ((_Manager_type)local_4f0._M_allocated_capacity != (_Manager_type)0x0) {
                        (*(code *)local_4f0._M_allocated_capacity)(&c_2,&c_2,3);
                      }
                    }
LAB_002ea8d7:
                    PopPrimPath(this);
                    bVar1 = true;
                  }
                  ::std::__cxx11::string::_M_dispose();
                  goto LAB_002eacd9;
                }
                bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                if ((!bVar1) || (bVar1 = Char1(this,&c_2), !bVar1)) break;
                if (c_2 == '}') goto LAB_002ea1e6;
                bVar1 = Rewind(this,1);
                if (!bVar1) break;
                tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                tok.super_string._M_string_length = 0;
                tok.super_string.field_2._M_local_buf[0] = '\0';
                bVar1 = ReadBasicType(this,(Identifier *)&tok.super_string);
                if (!bVar1) {
                  bVar1 = LookChar1(this,&c_2);
                  if ((bVar1) && (c_2 == ';')) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x136d);
                    ::std::operator<<(poVar2," ");
                    pcVar7 = "Semicolon is not allowd in `def` block statement.";
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1371);
                    ::std::operator<<(poVar2," ");
                    pcVar7 = "Failed to parse an identifier in `def` block statement.";
                  }
LAB_002ea600:
                  poVar2 = ::std::operator<<((ostream *)&ss_e,pcVar7);
                  ::std::operator<<(poVar2,"\n");
LAB_002ea9d1:
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,(string *)&vmap);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002eaa04:
                  ::std::__cxx11::string::_M_dispose();
                  break;
                }
                bVar1 = ::std::operator==(&tok.super_string,"variantSet");
                if (!bVar1) {
                  bVar1 = Rewind(this,tok.super_string._M_string_length);
                  if (!bVar1) goto LAB_002eaa04;
                  bVar1 = ::std::operator==(&tok.super_string,"def");
                  spec_00 = Def;
                  if (bVar1) {
LAB_002e9ff8:
                    primIdx_00 = ::std::function<long_(long)>::operator()
                                           (&this->_prim_idx_assign_fun,parentPrimIdx);
                    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           primIdx;
                    bVar1 = ParseBlock(this,spec_00,primIdx_00,primIdx,depth + 1,false);
                    if (!bVar1) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13ab);
                      ::std::operator<<(poVar2," ");
                      ::std::__cxx11::string::string
                                ((string *)&variantName,"`{}` block parse failed.",
                                 (allocator *)&local_368);
                      tinyusdz::to_string_abi_cxx11_(&pTy,(tinyusdz *)(ulong)spec_00,s_00);
                      fmt::format<std::__cxx11::string>
                                ((string *)&vmap,(fmt *)&variantName,(string *)&pTy,args);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&vmap);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      goto LAB_002ea9d1;
                    }
                  }
                  else {
                    bVar1 = ::std::operator==(&tok.super_string,"over");
                    spec_00 = Over;
                    if (bVar1) goto LAB_002e9ff8;
                    bVar1 = ::std::operator==(&tok.super_string,"class");
                    spec_00 = Class;
                    if (bVar1) goto LAB_002e9ff8;
                    bVar1 = ParsePrimProps(this,&props,propNames_00);
                    if (!bVar1) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13b2);
                      ::std::operator<<(poVar2," ");
                      pcVar7 = "Failed to parse Prim attribute.";
                      goto LAB_002ea600;
                    }
                  }
                  bVar1 = SkipWhitespaceAndNewline(this,true);
                  if (!bVar1) goto LAB_002eaa04;
                  ::std::__cxx11::string::_M_dispose();
                  goto LAB_002e9dfe;
                }
                bVar1 = SkipWhitespace(this);
                if (!bVar1) goto LAB_002eaa04;
                variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
                variantName._M_string_length = 0;
                variantName.field_2._M_local_buf[0] = '\0';
                bVar1 = ReadBasicType(this,&variantName);
                if (!bVar1) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x137b);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)&ss_e,
                                             "Failed to parse `variantSet` statement.");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,(string *)&vmap);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002ea6e4:
                  ::std::__cxx11::string::_M_dispose();
                  goto LAB_002eaa04;
                }
                bVar1 = SkipWhitespace(this);
                if (((!bVar1) || (bVar1 = Expect(this,'='), !bVar1)) ||
                   (bVar1 = SkipWhitespace(this), !bVar1)) goto LAB_002ea6e4;
                vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &vmap._M_t._M_impl.super__Rb_tree_header._M_header;
                vmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ulong)depth;
                vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar1 = ParseVariantSet(this,primIdx,parentPrimIdx,depth,&vmap);
                if (bVar1) {
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                  ::
                  _M_emplace_unique<std::__cxx11::string&,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>&>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                              *)&variantSetList,&variantName,&vmap);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x138e);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)&ss_e,
                                             "Failed to parse `variantSet` statement.");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,&pTy);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                }
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                ::~_Rb_tree(&vmap._M_t);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              } while (bVar1);
              bVar1 = false;
LAB_002eacd9:
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
              ::~_Rb_tree(&variantSetList._M_t);
              ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&propNames);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)&props);
            }
            else {
              bVar1 = false;
            }
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
            ::~_Rb_tree(&in_metas._M_t);
          }
          else {
LAB_002e9d61:
            bVar1 = false;
          }
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          bVar1 = false;
        }
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002e9c65;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12d3);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)&ss_e,"Invalid specifier.");
      ::std::operator<<(poVar2,"\n");
LAB_002e9c30:
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&vmap);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
  }
  bVar1 = false;
LAB_002e9c65:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ParseBlock(const Specifier spec, const int64_t primIdx,
                             const int64_t parentPrimIdx, const uint32_t depth,
                             const bool in_variantStaement) {
  (void)in_variantStaement;

  DCOUT("ParseBlock");

  if (!SkipCommentAndWhitespaceAndNewline()) {
    DCOUT("SkipCommentAndWhitespaceAndNewline failed");
    return false;
  }

  Identifier def;
  if (!ReadIdentifier(&def)) {
    DCOUT("ReadIdentifier failed");
    return false;
  }
  DCOUT("spec = " << def);

  if ((def == "def") || (def == "over") || (def == "class")) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN("Invalid specifier.");
  }

  // Ensure spec and def is same.
  if (def == "def") {
    if (spec != Specifier::Def) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "over") {
    if (spec != Specifier::Over) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "class") {
    if (spec != Specifier::Class) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // look ahead
  bool has_primtype = false;
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (!Rewind(1)) {
      return false;
    }

    if (c == '"') {
      // token
      has_primtype = false;
    } else {
      has_primtype = true;
    }
  }

  Identifier prim_type;

  DCOUT("has_primtype = " << has_primtype);

  if (has_primtype) {
    if (!ReadIdentifier(&prim_type)) {
      return false;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string prim_name;
  if (!ReadBasicType(&prim_name)) {
    return false;
  }

  DCOUT("prim name = " << prim_name);
  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Prim name contains invalid chacracter.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, std::pair<ListEditQual, MetaVariable>> in_metas;
  {
    // look ahead
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // meta

      if (!ParsePrimMetas(&in_metas)) {
        DCOUT("Parse Prim metas failed.");
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, Property> props;
  std::vector<value::token> propNames;
  VariantSetList variantSetList;

  {
    std::string full_path = GetCurrentPrimPath();
    if (full_path == "/") {
      full_path += prim_name;
    } else {
      full_path += "/" + prim_name;
    }
    PushPrimPath(full_path);
  }

  // expect = '}'
  //        | def_block
  //        | prim_attr+
  //        | variantSet '{' ... '}'
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      // end block
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read stmt token");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        // maybe ';'?

        if (LookChar1(&c)) {
          if (c == ';') {
            PUSH_ERROR_AND_RETURN(
                "Semicolon is not allowd in `def` block statement.");
          }
        }
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in `def` block statement.");
      }

      if (tok == "variantSet") {
        if (!SkipWhitespace()) {
          return false;
        }

        std::string variantName;
        if (!ReadBasicType(&variantName)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        DCOUT("variantName = " << variantName);

        if (!SkipWhitespace()) {
          return false;
        }

        if (!Expect('=')) {
          return false;
        }

        if (!SkipWhitespace()) {
          return false;
        }

        std::map<std::string, VariantContent> vmap;
        if (!ParseVariantSet(primIdx, parentPrimIdx, depth, &vmap)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        variantSetList.emplace(variantName, vmap);

        continue;
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      if (child_spec != Specifier::Invalid) {
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseDef. spec = " << to_string(child_spec) << ", idx = "
                                        << idx << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));
      } else {
        DCOUT("Enter ParsePrimProps.");
        // Assume PrimAttr
        if (!ParsePrimProps(&props, &propNames)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  std::string pTy = prim_type;

  if (_primspec_mode) {
    // Load scene as PrimSpec tree
    if (_primspec_fun) {
      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");

      // pass prim_type as is(empty = empty string)
      nonstd::expected<bool, std::string> ret =
          _primspec_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
            prim_type, prim_name, ret.error()));
      }
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "[Internal Error] PrimSpec handler is not found.");
    }

  } else {
    // Create typed Prim.

    if (prim_type.empty()) {
      // No Prim type specified. Treat it as Model

      pTy = "Model";
    }

    if (!_prim_construct_fun_map.count(pTy)) {
      if (_option.allow_unknown_prim) {
        // Unknown Prim type specified. Treat it as Model
        // Prim's type name will be storead in Model::prim_type_name
        pTy = "Model";
      }
    }

    if (_prim_construct_fun_map.count(pTy)) {
      auto construct_fun = _prim_construct_fun_map[pTy];

      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");
      nonstd::expected<bool, std::string> ret =
          construct_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN("Constructing Prim type `" + pTy +
                              "` failed: " + ret.error());
      }

    } else {
      PUSH_WARN(fmt::format(
          "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing.",
          pTy));
    }
  }

  PopPrimPath();

  return true;
}